

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

wchar_t * uriParsePathAbsEmptyW
                    (UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                    UriMemoryManager *memory)

{
  UriBool UVar1;
  wchar_t *afterLast_00;
  wchar_t *afterSegment;
  UriMemoryManager *memory_local;
  wchar_t *afterLast_local;
  wchar_t *first_local;
  UriParserStateW *state_local;
  
  state_local = (UriParserStateW *)afterLast;
  if ((first < afterLast) && (state_local = (UriParserStateW *)first, *first == L'/')) {
    afterLast_00 = uriParseSegmentW(state,first + 1,afterLast,memory);
    if (afterLast_00 == (wchar_t *)0x0) {
      state_local = (UriParserStateW *)0x0;
    }
    else {
      UVar1 = uriPushPathSegmentW(state,first + 1,afterLast_00,memory);
      if (UVar1 == 0) {
        uriStopMallocW(state,memory);
        state_local = (UriParserStateW *)0x0;
      }
      else {
        state_local = (UriParserStateW *)uriParsePathAbsEmptyW(state,afterLast_00,afterLast,memory);
      }
    }
  }
  return (wchar_t *)state_local;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParsePathAbsEmpty)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		const URI_CHAR * afterLast, UriMemoryManager * memory) {
	if (first >= afterLast) {
		return afterLast;
	}

	switch (*first) {
	case _UT('/'):
		{
			const URI_CHAR * const afterSegment
					= URI_FUNC(ParseSegment)(state, first + 1, afterLast, memory);
			if (afterSegment == NULL) {
				return NULL;
			}
			if (!URI_FUNC(PushPathSegment)(state, first + 1, afterSegment, memory)) { /* SEGMENT BOTH */
				URI_FUNC(StopMalloc)(state, memory);
				return NULL;
			}
			return URI_FUNC(ParsePathAbsEmpty)(state, afterSegment, afterLast, memory);
		}

	default:
		return first;
	}
}